

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall QFileSystemModel::sort(QFileSystemModel *this,int column,SortOrder order)

{
  QFileSystemModelPrivate *this_00;
  iterator index;
  iterator iVar1;
  type *node;
  pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *ppVar2;
  QModelIndex *oldNode;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 local_b8 [16];
  qsizetype local_a8;
  QFileSystemNode *local_98;
  quintptr qStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QArrayDataPointer<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> local_78;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  if (((this_00->sortOrder != order) || (this_00->sortColumn != column)) ||
     (this_00->forceSort == true)) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QModelIndex *)0x0;
    local_58.size = 0;
    QAbstractItemModel::layoutAboutToBeChanged((QList_conflict1 *)this,(LayoutChangeHint)&local_58);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)&local_58);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemModel::persistentIndexList();
    local_78.d = (Data *)0x0;
    local_78.ptr = (pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *)0x0;
    local_78.size = 0;
    QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::reserve
              ((QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *)&local_78,
               local_58.size);
    index = QList<QModelIndex>::begin((QList<QModelIndex> *)&local_58);
    iVar1 = QList<QModelIndex>::end((QList<QModelIndex> *)&local_58);
    for (; index.i != iVar1.i; index.i = index.i + 1) {
      local_98 = QFileSystemModelPrivate::node(this_00,index.i);
      local_b8._0_4_ = (index.i)->c;
      QList<std::pair<QFileSystemModelPrivate::QFileSystemNode*,int>>::
      emplaceBack<QFileSystemModelPrivate::QFileSystemNode*,int>
                ((QList<std::pair<QFileSystemModelPrivate::QFileSystemNode*,int>> *)&local_78,
                 &local_98,(int *)local_b8);
    }
    if (((this_00->sortColumn != column) || (this_00->sortOrder == order)) ||
       (this_00->forceSort == true)) {
      rootPath((QString *)local_b8,this);
      QFileSystemModel::index
                ((QFileSystemModel *)&local_98,(char *)this,
                 (int)(QArrayDataPointer<char16_t> *)local_b8);
      QFileSystemModelPrivate::sortChildren(this_00,column,(QModelIndex *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
      this_00->sortColumn = column;
      this_00->forceSort = false;
    }
    this_00->sortOrder = order;
    local_98 = (QFileSystemNode *)0x0;
    qStack_90 = 0;
    local_88.ptr = (QAbstractItemModel *)0x0;
    QList<QModelIndex>::reserve((QList<QModelIndex> *)&local_98,local_78.size);
    ppVar2 = local_78.ptr;
    for (lVar3 = local_78.size << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
      QFileSystemModelPrivate::index
                ((QFileSystemModelPrivate *)local_b8,(char *)this_00,(int)ppVar2->first);
      QList<QModelIndex>::emplaceBack<QModelIndex>
                ((QList<QModelIndex> *)&local_98,(QModelIndex *)local_b8);
      ppVar2 = ppVar2 + 1;
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict1 *)this,(QList_conflict1 *)&local_58);
    local_b8._0_8_ = (Data *)0x0;
    local_b8._8_8_ = (QPersistentModelIndex *)0x0;
    local_a8 = 0;
    QAbstractItemModel::layoutChanged
              ((QList_conflict1 *)this,
               (LayoutChangeHint)(QArrayDataPointer<QPersistentModelIndex> *)local_b8);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)local_b8);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_98);
    QArrayDataPointer<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::
    ~QArrayDataPointer(&local_78);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModel::sort(int column, Qt::SortOrder order)
{
    Q_D(QFileSystemModel);
    if (d->sortOrder == order && d->sortColumn == column && !d->forceSort)
        return;

    emit layoutAboutToBeChanged();
    QModelIndexList oldList = persistentIndexList();
    QList<std::pair<QFileSystemModelPrivate::QFileSystemNode *, int>> oldNodes;
    oldNodes.reserve(oldList.size());
    for (const QModelIndex &oldNode : oldList)
        oldNodes.emplace_back(d->node(oldNode), oldNode.column());

    if (!(d->sortColumn == column && d->sortOrder != order && !d->forceSort)) {
        //we sort only from where we are, don't need to sort all the model
        d->sortChildren(column, index(rootPath()));
        d->sortColumn = column;
        d->forceSort = false;
    }
    d->sortOrder = order;

    QModelIndexList newList;
    newList.reserve(oldNodes.size());
    for (const auto &[node, col]: std::as_const(oldNodes))
        newList.append(d->index(node, col));

    changePersistentIndexList(oldList, newList);
    emit layoutChanged({}, VerticalSortHint);
}